

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::mouse_released(Application *this,e_mouse_button b)

{
  if (b == MIDDLE) {
    this->middleDown = false;
  }
  else if (b == RIGHT) {
    this->rightDown = false;
  }
  else if (b == LEFT) {
    this->leftDown = false;
    this->draggingTimeline = false;
    DynamicScene::XFormWidget::updateGeometry(this->scene->elementTransform);
  }
  updateWidgets(this);
  return;
}

Assistant:

void Application::mouse_released(e_mouse_button b)
{
   switch (b)
   {
      case LEFT:
         leftDown = false;
         draggingTimeline = false;
         scene->elementTransform->updateGeometry();
         break;
      case RIGHT:
         rightDown = false;
         break;
      case MIDDLE:
         middleDown = false;
         break;
   }

   updateWidgets();
}